

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

usize __thiscall Console::Prompt::Private::readBufferedUtf8Char(Private *this,char *buffer)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  byte *pbVar4;
  usize uVar5;
  ssize_t sVar6;
  Memory *this_00;
  usize *puVar7;
  usize *puVar8;
  char *buffer_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *len;
  char ch;
  byte local_39;
  Buffer *local_38;
  
  pbVar4 = (this->bufferedInput).bufferStart;
  if (pbVar4 == (this->bufferedInput).bufferEnd) {
    sVar6 = read(0,&local_39,1);
    if ((sVar6 != 1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0x422,"read(STDIN_FILENO, &ch, 1) == 1"), iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (local_39 != 0x1b) {
      *buffer = local_39;
      uVar5 = 1;
      if ((((char)local_39 < '\0') && (uVar5 = 2, (local_39 & 0xe0) != 0xc0)) &&
         (uVar5 = 3, (local_39 & 0xf0) != 0xe0)) {
        uVar5 = (ulong)((local_39 & 0xf8) == 0xf0) << 2;
      }
      uVar5 = readUnbufferedUtf8Char(this,buffer,buffer + 1,uVar5);
      return uVar5;
    }
    *buffer = '\x1b';
    uVar5 = readUnbufferedEscapedSequence(this,buffer,buffer + 1);
  }
  else {
    *buffer = *pbVar4;
    pbVar4 = (this->bufferedInput).bufferStart + 1;
    (this->bufferedInput).bufferStart = pbVar4;
    if ((this->bufferedInput).bufferEnd <= pbVar4) {
      puVar8 = (usize *)(this->bufferedInput).buffer;
      puVar7 = &(this->bufferedInput)._capacity;
      if (puVar8 != (usize *)0x0) {
        puVar7 = puVar8;
      }
      (this->bufferedInput).bufferEnd = (byte *)puVar7;
      (this->bufferedInput).bufferStart = (byte *)puVar7;
    }
    bVar1 = *buffer;
    buffer_00 = buffer + 1;
    if (bVar1 != 0x1b) {
      len = (EVP_PKEY_CTX *)0x1;
      if ((((char)bVar1 < '\0') && (len = (EVP_PKEY_CTX *)0x2, (bVar1 & 0xe0) != 0xc0)) &&
         (len = (EVP_PKEY_CTX *)0x3, (bVar1 & 0xf0) != 0xe0)) {
        len = (EVP_PKEY_CTX *)((ulong)((bVar1 & 0xf8) == 0xf0) << 2);
      }
      if (1 < (uint)len) {
        local_38 = &this->bufferedInput;
        src = (EVP_PKEY_CTX *)0x1;
        do {
          pbVar4 = (this->bufferedInput).bufferStart;
          if (pbVar4 == (this->bufferedInput).bufferEnd) {
            uVar5 = readUnbufferedUtf8Char(this,buffer,(char *)(src + (long)buffer),(usize)len);
            return uVar5;
          }
          buffer[(long)src] = *pbVar4;
          pbVar4 = (this->bufferedInput).bufferStart + 1;
          (this->bufferedInput).bufferStart = pbVar4;
          if ((this->bufferedInput).bufferEnd <= pbVar4) {
            puVar8 = (usize *)(this->bufferedInput).buffer;
            if (puVar8 == (usize *)0x0) {
              puVar8 = &(this->bufferedInput)._capacity;
            }
            (this->bufferedInput).bufferEnd = (byte *)puVar8;
            (this->bufferedInput).bufferStart = (byte *)puVar8;
          }
          if (buffer[(long)src] == '\x1b') {
            this_00 = (Memory *)operator_new__((ulong)(src + 1));
            Memory::copy(this_00,(EVP_PKEY_CTX *)buffer,src);
            this_00[(long)src] = (Memory)0x0;
            *buffer = '\x1b';
            uVar5 = readBufferedEscapedSequence(this,buffer,buffer_00);
            Buffer::prepend(local_38,(byte *)this_00,(usize)src);
            operator_delete__(this_00);
            return uVar5 + 1;
          }
          src = src + 1;
        } while (src < len);
        buffer_00 = buffer + (long)src;
      }
      *buffer_00 = '\0';
      return (usize)len;
    }
    uVar5 = readBufferedEscapedSequence(this,buffer,buffer_00);
  }
  return uVar5 + 1;
}

Assistant:

usize readBufferedUtf8Char(char* buffer)
  {
    if(bufferedInput.isEmpty())
    {
      char ch;
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = '\x1b';
        return 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
      }
      *buffer = ch;
      return readUnbufferedUtf8Char(buffer, buffer + 1, Unicode::length(ch));
    }
    *buffer = *(const char*)(const byte*)bufferedInput;
    bufferedInput.removeFront(1);
    if(*buffer == '\x1b')
      return 1 + readBufferedEscapedSequence(buffer, buffer + 1);
    char* start = buffer;
    usize len = Unicode::length(*(buffer++));
    while((usize)(buffer - start) < len)
    {
      if(bufferedInput.isEmpty())
        return readUnbufferedUtf8Char(start, buffer, len);
      *buffer = *(const char*)(const byte*)bufferedInput;
      bufferedInput.removeFront(1);
      if(*buffer == '\x1b')
      {
        Buffer incompleteUtf8((const byte*)start, buffer - start);
        *start = '\x1b';
        usize result = 1 + readBufferedEscapedSequence(start, start + 1);
        bufferedInput.prepend(incompleteUtf8);
        return result;
      }
      ++buffer;
    }
    *buffer = '\0';
    return len;
  }